

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::ForceBitpackingModeSetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  BitpackingMode BVar1;
  ParserException *this;
  allocator local_59;
  string local_58;
  string mode_str;
  
  Value::ToString_abi_cxx11_(&local_58,input);
  StringUtil::Lower(&mode_str,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  BVar1 = BitpackingModeFromString(&mode_str);
  if (BVar1 != INVALID) {
    (config->options).force_bitpacking_mode = BVar1;
    ::std::__cxx11::string::~string((string *)&mode_str);
    return;
  }
  this = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_58,
             "Unrecognized option for force_bitpacking_mode, expected none, constant, constant_delta, delta_for, or for"
             ,&local_59);
  ParserException::ParserException(this,&local_58);
  __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ForceBitpackingModeSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto mode_str = StringUtil::Lower(input.ToString());
	auto mode = BitpackingModeFromString(mode_str);
	if (mode == BitpackingMode::INVALID) {
		throw ParserException("Unrecognized option for force_bitpacking_mode, expected none, constant, constant_delta, "
		                      "delta_for, or for");
	}
	config.options.force_bitpacking_mode = mode;
}